

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  cmOutputConverter *this_00;
  pointer puVar1;
  cmake *this_01;
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> _Var2;
  cmMakefile *pcVar3;
  pointer pbVar4;
  bool bVar5;
  string *psVar6;
  ostream *poVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  pointer puVar8;
  pointer path;
  cmGlobalUnixMakefileGenerator3 *this_02;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  LocalGeneratorVector *__range1;
  string tmpStr;
  string check;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3c8;
  cmAlphaNum local_3a8;
  LocalGeneratorVector *local_378;
  pointer local_370;
  cmAlphaNum local_368;
  string local_338;
  undefined1 local_318 [32];
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [32];
  byte abStack_298 [584];
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&local_3a8);
  bVar5 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_2b8);
  std::__cxx11::string::~string((string *)local_2b8);
  if (!bVar5) {
    psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    local_2b8._8_8_ = (psVar6->_M_dataplus)._M_p;
    local_2b8._0_8_ = psVar6->_M_string_length;
    local_3a8.View_._M_len = (size_t)&DAT_0000001a;
    local_3a8.View_._M_str = "/CMakeFiles/Makefile.cmake";
    cmStrCat<>((string *)(local_318 + 0x40),(cmAlphaNum *)local_2b8,&local_3a8);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_2b8,(string *)(local_318 + 0x40),false,None);
    if ((abStack_298[*(long *)(local_2b8._0_8_ + -0x18)] & 5) == 0) {
      psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_3a8.View_._M_str = (psVar6->_M_dataplus)._M_p;
      local_3a8.View_._M_len = psVar6->_M_string_length;
      local_368.View_._M_len = (size_t)&DAT_00000009;
      local_368.View_._M_str = "/Makefile";
      cmStrCat<>((string *)(local_318 + 0x20),&local_3a8,&local_368);
      cmLocalUnixMakefileGenerator3::WriteDisclaimer
                ((cmLocalUnixMakefileGenerator3 *)
                 (((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t,(ostream *)local_2b8);
      poVar7 = std::operator<<((ostream *)local_2b8,"# The generator used is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_DEPENDS_GENERATOR \"");
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
                (&local_3a8);
      poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
      std::operator<<(poVar7,"\")\n\n");
      local_378 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
      std::__cxx11::string::~string((string *)&local_3a8);
      local_3c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_3c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1
          ) {
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (&local_3c8,
                   &((puVar8->_M_t).
                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile->
                    ListFiles);
      }
      this_01 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
      bVar5 = cmake::DoWriteGlobVerifyTarget(this_01);
      if (bVar5) {
        psVar6 = cmake::GetGlobVerifyScript_abi_cxx11_(this_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_3c8,psVar6);
        psVar6 = cmake::GetGlobVerifyStamp_abi_cxx11_(this_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_3c8,psVar6);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                (local_3c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_3c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (local_3c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_3c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&local_3c8,(const_iterator)__first._M_current,
              (const_iterator)
              local_3c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
      _Var2._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
      super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
           (((local_378->
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
      poVar7 = std::operator<<((ostream *)local_2b8,
                               "# The top level Makefile was generated from the following files:\n")
      ;
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_DEPENDS\n");
      std::operator<<(poVar7,"  \"CMakeCache.txt\"\n");
      pbVar4 = local_3c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_00 = (cmOutputConverter *)
                ((long)_Var2._M_t.
                       super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                       .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl + 8);
      for (path = local_3c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; path != pbVar4; path = path + 1) {
        poVar7 = std::operator<<((ostream *)local_2b8,"  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir((string *)&local_3a8,this_00,path);
        poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_3a8);
      }
      std::operator<<((ostream *)local_2b8,"  )\n\n");
      psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_
                         ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      local_3a8.View_._M_str = (psVar6->_M_dataplus)._M_p;
      local_3a8.View_._M_len = psVar6->_M_string_length;
      local_368.View_._M_len = 0x1d;
      local_368.View_._M_str = "/CMakeFiles/cmake.check_cache";
      cmStrCat<>((string *)local_318,&local_3a8,&local_368);
      poVar7 = std::operator<<((ostream *)local_2b8,"# The corresponding makefile is:\n");
      poVar7 = std::operator<<(poVar7,"set(CMAKE_MAKEFILE_OUTPUTS\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmOutputConverter::MaybeRelativeToCurBinDir
                ((string *)&local_3a8,this_00,(string *)(local_318 + 0x20));
      poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
      poVar7 = std::operator<<(poVar7,"\"\n");
      poVar7 = std::operator<<(poVar7,"  \"");
      cmOutputConverter::MaybeRelativeToCurBinDir((string *)&local_368,this_00,(string *)local_318);
      poVar7 = std::operator<<(poVar7,(string *)&local_368);
      std::operator<<(poVar7,"\"\n");
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::operator<<((ostream *)local_2b8,"  )\n\n");
      poVar7 = std::operator<<((ostream *)local_2b8,"# Byproducts of CMake generate step:\n");
      std::operator<<(poVar7,"set(CMAKE_MAKEFILE_PRODUCTS\n");
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      local_338._M_string_length = 0;
      local_338.field_2._M_local_buf[0] = '\0';
      local_370 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar8 != local_370;
          puVar8 = puVar8 + 1) {
        pcVar3 = ((puVar8->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                  .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
        pbVar4 = (pcVar3->OutputFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = *(string **)
                       &(pcVar3->OutputFiles).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl; psVar6 != pbVar4; psVar6 = psVar6 + 1) {
          poVar7 = std::operator<<((ostream *)local_2b8,"  \"");
          cmOutputConverter::MaybeRelativeToTopBinDir((string *)&local_3a8,this_00,psVar6);
          poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
          std::operator<<(poVar7,"\"\n");
          std::__cxx11::string::~string((string *)&local_3a8);
        }
        psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           ((puVar8->_M_t).
                            super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                            .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
        local_3a8.View_._M_str = (psVar6->_M_dataplus)._M_p;
        local_3a8.View_._M_len = psVar6->_M_string_length;
        local_368.View_._M_len = 0x2b;
        local_368.View_._M_str = "/CMakeFiles/CMakeDirectoryInformation.cmake";
        cmStrCat<>(&local_50,&local_3a8,&local_368);
        std::__cxx11::string::operator=((string *)&local_338,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        poVar7 = std::operator<<((ostream *)local_2b8,"  \"");
        cmOutputConverter::MaybeRelativeToTopBinDir
                  ((string *)&local_3a8,
                   &((puVar8->_M_t).
                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                    super_cmOutputConverter,&local_338);
        poVar7 = std::operator<<(poVar7,(string *)&local_3a8);
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_3a8);
      }
      std::operator<<((ostream *)local_2b8,"  )\n\n");
      std::__cxx11::string::~string((string *)&local_338);
      this_02 = (cmGlobalUnixMakefileGenerator3 *)local_318;
      std::__cxx11::string::~string((string *)this_02);
      WriteMainCMakefileLanguageRules(this_02,(cmGeneratedFileStream *)local_2b8,local_378);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_3c8);
      std::__cxx11::string::~string((string *)(local_318 + 0x20));
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b8);
    std::__cxx11::string::~string((string *)(local_318 + 0x40));
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  if (this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    return;
  }

  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
             "/CMakeFiles/Makefile.cmake");
  cmGeneratedFileStream cmakefileStream(cmakefileName);
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(), "/Makefile");

  {
    // get a local generator for some useful methods
    auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Write the do not edit header.
    lg.WriteDisclaimer(cmakefileStream);
  }

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (const auto& localGen : this->LocalGenerators) {
    // Get the list of files contributing to this generation step.
    cm::append(lfiles, localGen->GetMakefile()->GetListFiles());
  }

  cmake* cm = this->GetCMakeInstance();
  if (cm->DoWriteGlobVerifyTarget()) {
    lfiles.push_back(cm->GetGlobVerifyScript());
    lfiles.push_back(cm->GetGlobVerifyStamp());
  }

  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  auto new_end = std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  {
    // reset lg to the first makefile
    const auto& lg = cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(
      this->LocalGenerators[0]);

    // Save the list to the cmake file.
    cmakefileStream
      << "# The top level Makefile was generated from the following files:\n"
      << "set(CMAKE_MAKEFILE_DEPENDS\n"
      << "  \"CMakeCache.txt\"\n";
    for (std::string const& f : lfiles) {
      cmakefileStream << "  \"" << lg.MaybeRelativeToCurBinDir(f) << "\"\n";
    }
    cmakefileStream << "  )\n\n";

    // Build the path to the cache check file.
    std::string check =
      cmStrCat(this->GetCMakeInstance()->GetHomeOutputDirectory(),
               "/CMakeFiles/cmake.check_cache");

    // Set the corresponding makefile in the cmake file.
    cmakefileStream << "# The corresponding makefile is:\n"
                    << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(makefileName)
                    << "\"\n"
                    << "  \"" << lg.MaybeRelativeToCurBinDir(check) << "\"\n";
    cmakefileStream << "  )\n\n";

    // CMake must rerun if a byproduct is missing.
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";

    // add in any byproducts and all the directory information files
    std::string tmpStr;
    for (const auto& localGen : this->LocalGenerators) {
      for (std::string const& outfile :
           localGen->GetMakefile()->GetOutputFiles()) {
        cmakefileStream << "  \"" << lg.MaybeRelativeToTopBinDir(outfile)
                        << "\"\n";
      }
      tmpStr = cmStrCat(localGen->GetCurrentBinaryDirectory(),
                        "/CMakeFiles/CMakeDirectoryInformation.cmake");
      cmakefileStream << "  \"" << localGen->MaybeRelativeToTopBinDir(tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}